

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
::
TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
          (TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
           *this)

{
  TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell_00348300
  ;
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedLongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    unsigned long long int ret_value = 1;
    unsigned long long int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    UNSIGNED_LONGLONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(ret_value, mock().returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(another_ret_value, mock().returnValue().getUnsignedLongLongIntValue());
}